

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O1

unsigned_long_long get_big_unsigned(FMFieldPtr field,void *data)

{
  ushort uVar1;
  FMdata_type FVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  unsigned_long_long uVar6;
  size_t sVar7;
  ulong uVar8;
  int i;
  long lVar9;
  void *in_RDX;
  void *data_00;
  undefined1 uVar10;
  undefined7 uVar11;
  bool bVar12;
  longdouble in_ST0;
  unsigned_long tmp;
  unsigned_long_long auStack_30 [2];
  unsigned_long_long local_10 [2];
  
  uVar10 = SUB81(data,0);
  uVar11 = (undefined7)((ulong)data >> 8);
  switch(field->data_type) {
  case integer_type:
    uVar6 = get_big_int(field,data);
    return uVar6;
  case unsigned_type:
  case enumeration_type:
  case boolean_type:
    switch(field->size) {
    case 1:
      local_10[0] = (unsigned_long_long)*(byte *)((long)data + field->offset);
      break;
    case 2:
      uVar1 = *(ushort *)((long)data + field->offset);
      bVar12 = field->byte_swap == '\0';
      uVar4 = (uint)uVar1;
      if (bVar12) {
        uVar4 = (uint)(uVar1 >> 8);
      }
      uVar5 = (uint)(uVar1 >> 8);
      if (bVar12) {
        uVar5 = (uint)uVar1;
      }
      local_10[0] = (unsigned_long_long)(uVar5 & 0xff | (uVar4 & 0xff) << 8);
      break;
    case 4:
      local_10[0] = CONCAT44(local_10[0]._4_4_,*(undefined4 *)((long)data + field->offset));
      if (field->byte_swap != '\0') {
        uVar8 = 0x300000000;
        lVar9 = 0;
        do {
          uVar10 = *(undefined1 *)((long)local_10 + lVar9);
          *(undefined1 *)((long)local_10 + lVar9) =
               *(undefined1 *)((long)local_10 + (uVar8 >> 0x20));
          *(undefined1 *)((long)local_10 + (uVar8 >> 0x20)) = uVar10;
          lVar9 = lVar9 + 1;
          uVar8 = uVar8 - 0x100000000;
        } while (lVar9 != 2);
      }
      local_10[0] = local_10[0] & 0xffffffff;
      break;
    case 8:
      local_10[0] = *(unsigned_long_long *)((long)data + field->offset);
      if (field->byte_swap != '\0') {
        uVar8 = 0x700000000;
        lVar9 = 0;
        do {
          uVar10 = *(undefined1 *)((long)local_10 + lVar9);
          *(undefined1 *)((long)local_10 + lVar9) =
               *(undefined1 *)((long)local_10 + (uVar8 >> 0x20));
          *(undefined1 *)((long)local_10 + (uVar8 >> 0x20)) = uVar10;
          lVar9 = lVar9 + 1;
          uVar8 = uVar8 - 0x100000000;
        } while (lVar9 != 4);
      }
      break;
    default:
      if (field->size == 0x10) {
        bVar12 = field->byte_swap == '\0';
        sVar7 = field->offset + 8;
        if (bVar12) {
          sVar7 = field->offset;
        }
        local_10[0] = *(unsigned_long_long *)((long)data + sVar7);
        if (bVar12) {
          return *(unsigned_long_long *)((long)data + sVar7);
        }
        uVar8 = 0x700000000;
        lVar9 = 0;
        do {
          uVar10 = *(undefined1 *)((long)local_10 + lVar9);
          *(undefined1 *)((long)local_10 + lVar9) =
               *(undefined1 *)((long)local_10 + (uVar8 >> 0x20));
          *(undefined1 *)((long)local_10 + (uVar8 >> 0x20)) = uVar10;
          lVar9 = lVar9 + 1;
          uVar8 = uVar8 - 0x100000000;
        } while (lVar9 != 4);
        return local_10[0];
      }
    case 3:
    case 5:
    case 6:
    case 7:
      if (get_long_warn == 0) {
        get_big_unsigned_cold_1();
      }
      local_10[0] = 0;
    }
    break;
  case float_type:
    get_big_float((longdouble *)field,(FMFieldPtr)data,in_RDX);
    local_10[0] = (unsigned_long_long)in_ST0;
    break;
  default:
    get_big_unsigned_cold_2();
    FVar2 = field->data_type;
    if (FVar2 == float_type) {
      get_big_float((longdouble *)field,(FMFieldPtr)CONCAT71(uVar11,uVar10),data_00);
      auStack_30[0] = (unsigned_long_long)in_ST0;
    }
    else {
      if (FVar2 == unsigned_type) {
        uVar6 = get_big_unsigned(field,(void *)CONCAT71(uVar11,uVar10));
        return uVar6;
      }
      if (FVar2 != integer_type) {
        get_big_int_cold_2();
        uVar6 = get_big_unsigned(field,(void *)CONCAT71(uVar11,uVar10));
        return uVar6;
      }
      switch(field->size) {
      case 1:
        auStack_30[0] = (unsigned_long_long)*(char *)(CONCAT71(uVar11,uVar10) + field->offset);
        break;
      case 2:
        uVar1 = *(ushort *)(CONCAT71(uVar11,uVar10) + field->offset);
        uVar3 = uVar1 >> 8;
        if (field->byte_swap == '\0') {
          uVar3 = uVar1;
          uVar1 = uVar1 >> 8;
        }
        auStack_30[0] = (unsigned_long_long)(short)(uVar3 & 0xff | uVar1 << 8);
        break;
      case 4:
        auStack_30[0] =
             CONCAT44(auStack_30[0]._4_4_,*(undefined4 *)(CONCAT71(uVar11,uVar10) + field->offset));
        if (field->byte_swap != '\0') {
          uVar8 = 0x300000000;
          lVar9 = 0;
          do {
            uVar10 = *(undefined1 *)((long)auStack_30 + lVar9);
            *(undefined1 *)((long)auStack_30 + lVar9) =
                 *(undefined1 *)((long)auStack_30 + (uVar8 >> 0x20));
            *(undefined1 *)((long)auStack_30 + (uVar8 >> 0x20)) = uVar10;
            lVar9 = lVar9 + 1;
            uVar8 = uVar8 - 0x100000000;
          } while (lVar9 != 2);
        }
        auStack_30[0] = (unsigned_long_long)(int)auStack_30[0];
        break;
      case 8:
        auStack_30[0] = *(unsigned_long_long *)(CONCAT71(uVar11,uVar10) + field->offset);
        if (field->byte_swap != '\0') {
          uVar8 = 0x700000000;
          lVar9 = 0;
          do {
            uVar10 = *(undefined1 *)((long)auStack_30 + lVar9);
            *(undefined1 *)((long)auStack_30 + lVar9) =
                 *(undefined1 *)((long)auStack_30 + (uVar8 >> 0x20));
            *(undefined1 *)((long)auStack_30 + (uVar8 >> 0x20)) = uVar10;
            lVar9 = lVar9 + 1;
            uVar8 = uVar8 - 0x100000000;
          } while (lVar9 != 4);
        }
        break;
      default:
        if (field->size == 0x10) {
          bVar12 = field->byte_swap == '\0';
          sVar7 = field->offset + 8;
          if (bVar12) {
            sVar7 = field->offset;
          }
          auStack_30[0] = *(unsigned_long_long *)(CONCAT71(uVar11,uVar10) + sVar7);
          if (bVar12) {
            return auStack_30[0];
          }
          uVar8 = 0x700000000;
          lVar9 = 0;
          do {
            uVar10 = *(undefined1 *)((long)auStack_30 + lVar9);
            *(undefined1 *)((long)auStack_30 + lVar9) =
                 *(undefined1 *)((long)auStack_30 + (uVar8 >> 0x20));
            *(undefined1 *)((long)auStack_30 + (uVar8 >> 0x20)) = uVar10;
            lVar9 = lVar9 + 1;
            uVar8 = uVar8 - 0x100000000;
          } while (lVar9 != 4);
          return auStack_30[0];
        }
      case 3:
      case 5:
      case 6:
      case 7:
        auStack_30[0] = 0xffffffffffffffff;
        if (get_long_warn == 0) {
          get_big_int_cold_1();
        }
      }
    }
    return auStack_30[0];
  }
  return local_10[0];
}

Assistant:

static MAX_UNSIGNED_TYPE
get_big_unsigned(FMFieldPtr field, void *data)
{
    if ((field->data_type == unsigned_type) || 
	(field->data_type == enumeration_type) || 
	(field->data_type == boolean_type)) {
	if (field->size == sizeof(char)) {
	    unsigned char tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(char));
	    return (MAX_UNSIGNED_TYPE) tmp;
	} else if (field->size == sizeof(short)) {
	    unsigned short tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(short));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(short));
	    return (MAX_UNSIGNED_TYPE) tmp;
	} else if (field->size == sizeof(int)) {
	    unsigned int tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(int));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(int));
	    return (MAX_UNSIGNED_TYPE) tmp;
	} else if (field->size == sizeof(size_t)) {
	    size_t tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(size_t));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(size_t));
	    return tmp;
	} else if (field->size == 2 * sizeof(long)) {
	    unsigned long tmp;
	    size_t low_bytes_offset = field->offset;
	    if (WORDS_BIGENDIAN) {
		if (!field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    } else {
		if (field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    }
	    memcpy(&tmp, (char *) data + low_bytes_offset, sizeof(long));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(long));
	    return tmp;
	} else {
	    if (!get_long_warn) {
		fprintf(stderr, "Get Long failed!  Size problems.  File int size is %d.\n", field->size);
		get_long_warn++;
	    }
	    return 0;
	}
    } else if (field->data_type == integer_type) {
	MAX_INTEGER_TYPE tmp = get_big_int(field, data);
	return (MAX_UNSIGNED_TYPE) tmp;
    } else if (field->data_type == float_type) {
	MAX_FLOAT_TYPE tmp = get_big_float(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	return (MAX_UNSIGNED_TYPE) (long) (double) tmp;
#else
	return (MAX_UNSIGNED_TYPE) tmp;
#endif
    } else {
	fprintf(stderr, "Get IOulong failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}